

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDynCalls.cpp
# Opt level: O0

void __thiscall
wasm::GenerateDynCalls::generateDynCallThunk(GenerateDynCalls *this,HeapType funcType)

{
  pointer *this_00;
  IString str;
  Name name_00;
  Name name_01;
  bool bVar1;
  Fatal *this_01;
  Module *wasm_00;
  Function *pFVar2;
  Export *pEVar3;
  Type *__args_1;
  LocalGet *target;
  Table *pTVar4;
  reference this_02;
  pointer pTVar5;
  CallIndirect *pCVar6;
  pointer pFVar7;
  Type in_RCX;
  Type extraout_RDX;
  undefined1 must_export;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args_00;
  Iterator IVar8;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar9;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar10;
  Signature sig_00;
  Name name_02;
  Name name_03;
  Name name_04;
  Name local_478 [2];
  Name local_458;
  Address local_448;
  Address local_440;
  HeapType local_438;
  Address local_430;
  string_view local_428;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> local_418;
  Table *local_410;
  Table *table;
  LocalGet *local_400;
  Type *local_3f8;
  Type *local_3f0;
  Iterator __end1_1;
  Iterator __begin1_1;
  Type *__range1_1;
  undefined1 local_3c0 [4];
  Index i;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  Expression *fptr;
  Type TStack_390;
  pointer local_388;
  uintptr_t local_378;
  Tuple local_370;
  Type local_358;
  Signature local_350;
  HeapType local_340;
  Module *local_338;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> *pvStack_330;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_328;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> f;
  Type *param;
  Iterator __end1;
  Iterator __begin1;
  Type *__range1;
  int p;
  BasicType local_2bc;
  undefined1 local_2b8 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> params;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> namedParams;
  string local_258;
  allocator<char> local_231;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 auStack_1f0 [8];
  Name name;
  Builder builder;
  Module *wasm;
  Fatal local_1b0;
  undefined1 local_28 [8];
  Signature sig;
  GenerateDynCalls *this_local;
  HeapType funcType_local;
  
  sig.results.id = (uintptr_t)this;
  this_local = (GenerateDynCalls *)funcType.id;
  _local_28 = HeapType::getSignature((HeapType *)&this_local);
  bVar1 = wasm::Type::isTuple(&sig.params);
  if (bVar1) {
    Fatal::Fatal(&local_1b0);
    this_01 = Fatal::operator<<(&local_1b0,
                                (char (*) [60])
                                "GenerateDynCalls: Cannot operate on multiple return values:");
    Fatal::operator<<(this_01,&sig.params);
    Fatal::~Fatal(&local_1b0);
  }
  if ((this->onlyI64 & 1U) != 0) {
    sig_00.results.id = extraout_RDX.id;
    sig_00.params.id = sig.params.id;
    bVar1 = hasI64((wasm *)local_28,sig_00);
    if (!bVar1) {
      return;
    }
  }
  wasm_00 = Walker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>::getModule
                      (&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>_>
                        ).
                        super_PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>
                        .
                        super_Walker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>
                      );
  Builder::Builder((Builder *)&name.super_IString.str._M_str,wasm_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"dynCall_",&local_231);
  getSig_abi_cxx11_(&local_258,(wasm *)sig.params.id,(Type)local_28,in_RCX);
  std::operator+(&local_210,&local_230,&local_258);
  wasm::Name::Name((Name *)auStack_1f0,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  name_01.super_IString.str._M_str = (char *)name.super_IString.str._M_len;
  name_01.super_IString.str._M_len = (size_t)auStack_1f0;
  pFVar2 = Module::getFunctionOrNull(wasm_00,name_01);
  if ((pFVar2 == (Function *)0x0) &&
     (name_00.super_IString.str._M_str = (char *)name.super_IString.str._M_len,
     name_00.super_IString.str._M_len = (size_t)auStack_1f0,
     pEVar3 = Module::getExportOrNull(wasm_00,name_00), pEVar3 == (Export *)0x0)) {
    this_00 = &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::vector
              ((vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)this_00);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_2b8);
    local_2bc = i32;
    std::vector<wasm::NameType,std::allocator<wasm::NameType>>::
    emplace_back<char_const(&)[5],wasm::Type::BasicType>
              ((vector<wasm::NameType,std::allocator<wasm::NameType>> *)this_00,(char (*) [5])"fptr"
               ,&local_2bc);
    wasm::Type::Type((Type *)&stack0xfffffffffffffd38,i32);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_2b8,
               (value_type *)&stack0xfffffffffffffd38);
    __range1._4_4_ = 0;
    IVar8 = wasm::Type::begin((Type *)local_28);
    __end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
         (size_t)IVar8.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
    PVar9 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
            wasm::Type::end((Type *)local_28);
    while( true ) {
      __end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)PVar9.index;
      param = PVar9.parent;
      bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                        ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                         &__end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                          .index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                                 &param);
      if (!bVar1) break;
      __args_1 = wasm::Type::Iterator::operator*
                           ((Iterator *)
                            &__end1.
                             super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             index);
      std::__cxx11::to_string((string *)&f,__range1._4_4_);
      std::vector<wasm::NameType,std::allocator<wasm::NameType>>::
      emplace_back<std::__cxx11::string,wasm::Type_const&>
                ((vector<wasm::NameType,std::allocator<wasm::NameType>> *)
                 &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,__args_1);
      std::__cxx11::string::~string((string *)&f);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_2b8,__args_1);
      ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                 &__end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
      PVar9.index = (size_t)__end1.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            parent;
      PVar9.parent = param;
      __range1._4_4_ = __range1._4_4_ + 1;
    }
    local_338 = (Module *)auStack_1f0;
    pvStack_330 = (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)
                  name.super_IString.str._M_len;
    Tuple::Tuple(&local_370,(TypeList *)local_2b8);
    wasm::Type::Type(&local_358,&local_370);
    local_378 = sig.params.id;
    Signature::Signature(&local_350,local_358,sig.params);
    HeapType::HeapType(&local_340,local_350);
    fptr = (Expression *)0x0;
    TStack_390.id = 0;
    local_388 = (pointer)0x0;
    std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::vector
              ((vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)&fptr);
    name_03.super_IString.str._M_str = (char *)local_338;
    name_03.super_IString.str._M_len = (size_t)&local_328;
    Builder::makeFunction
              (name_03,pvStack_330,
               (HeapType)
               &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)local_340.id,
               (Expression *)&fptr);
    std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::~vector
              ((vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)&fptr);
    Tuple::~Tuple(&local_370);
    wasm::Type::Type((Type *)&args.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,i32);
    target = Builder::makeLocalGet
                       ((Builder *)&name.super_IString.str._M_str,0,
                        (Type)args.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_3c0);
    __range1_1._4_4_ = 0;
    IVar8 = wasm::Type::begin((Type *)local_28);
    __end1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
         (size_t)IVar8.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
    PVar10 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
             wasm::Type::end((Type *)local_28);
    while( true ) {
      __end1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)PVar10.index;
      local_3f0 = PVar10.parent;
      bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                        ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                         &__end1_1.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
                         (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)&local_3f0
                        );
      if (!bVar1) break;
      local_3f8 = wasm::Type::Iterator::operator*
                            ((Iterator *)
                             &__end1_1.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index);
      __range1_1._4_4_ = __range1_1._4_4_ + 1;
      table = (Table *)local_3f8->id;
      local_400 = Builder::makeLocalGet
                            ((Builder *)&name.super_IString.str._M_str,__range1_1._4_4_,(Type)table)
      ;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_3c0,
                 (value_type *)&local_400);
      ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                 &__end1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                );
      PVar10.index = (size_t)__end1_1.
                             super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent;
      PVar10.parent = local_3f0;
    }
    bVar1 = std::
            vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
            ::empty(&wasm_00->tables);
    if (bVar1) {
      local_428 = (string_view)wasm::Name::fromInt(0);
      HeapType::HeapType(&local_438,func);
      wasm::Type::Type((Type *)&local_430,local_438,Nullable);
      wasm::Address::Address(&local_440,0);
      wasm::Address::Address(&local_448,0xffffffff);
      name_04.super_IString.str._M_str = (char *)local_428._M_len;
      name_04.super_IString.str._M_len = (size_t)&local_418;
      Builder::makeTable(name_04,(Type)local_428._M_str,local_430,local_440);
      pTVar4 = Module::addTable(wasm_00,&local_418);
      std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::~unique_ptr(&local_418);
      local_478[1].super_IString.str._M_len = ENV._0_8_;
      local_478[1].super_IString.str._M_str = (char *)ENV._8_8_;
      str.str._M_str = (char *)ENV._8_8_;
      str.str._M_len = ENV._0_8_;
      local_410 = pTVar4;
      wasm::Name::Name(&local_458,str);
      wasm::Name::operator=(&(local_410->super_Importable).module,&local_458);
      wasm::Name::Name(local_478,"__indirect_function_table");
      wasm::Name::operator=(&(local_410->super_Importable).base,local_478);
    }
    this_02 = std::
              vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
              ::operator[](&wasm_00->tables,0);
    pTVar5 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(this_02);
    args_00 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_3c0;
    pCVar6 = Builder::
             makeCallIndirect<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                       ((Builder *)&name.super_IString.str._M_str,
                        (Name)(pTVar5->super_Importable).super_Named.name.super_IString.str,
                        (Expression *)target,args_00,(HeapType)this_local,false);
    must_export = SUB81(args_00,0);
    pFVar7 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_328);
    pFVar7->body = (Expression *)pCVar6;
    Module::addFunction(wasm_00,&local_328);
    name_02.super_IString.str._M_str = (char *)0x1;
    name_02.super_IString.str._M_len = name.super_IString.str._M_len;
    exportFunction((wasm *)wasm_00,(Module *)auStack_1f0,name_02,(bool)must_export);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_3c0);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_328);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_2b8);
    std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::~vector
              ((vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)
               &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void GenerateDynCalls::generateDynCallThunk(HeapType funcType) {
  Signature sig = funcType.getSignature();

  if (sig.results.isTuple()) {
    // Emscripten output is assumed to be MVP, and not to have multiple return
    // values. In particular, signatures in Emscripten all look like "abcd"
    // where "a" is the single return value, and "bcd" are the (in this case
    // three) parameters.
    Fatal() << "GenerateDynCalls: Cannot operate on multiple return values:"
            << sig.results;
  }

  if (onlyI64 && !hasI64(sig)) {
    return;
  }

  Module* wasm = getModule();
  Builder builder(*wasm);
  Name name = std::string("dynCall_") + getSig(sig.results, sig.params);
  if (wasm->getFunctionOrNull(name) || wasm->getExportOrNull(name)) {
    return; // module already contains this dyncall
  }
  std::vector<NameType> namedParams;
  std::vector<Type> params;
  namedParams.emplace_back("fptr", Type::i32); // function pointer param
  params.push_back(Type::i32);
  int p = 0;
  for (const auto& param : sig.params) {
    namedParams.emplace_back(std::to_string(p++), param);
    params.push_back(param);
  }
  auto f = builder.makeFunction(
    name, std::move(namedParams), Signature(Type(params), sig.results), {});
  Expression* fptr = builder.makeLocalGet(0, Type::i32);
  std::vector<Expression*> args;
  Index i = 0;
  for (const auto& param : sig.params) {
    args.push_back(builder.makeLocalGet(++i, param));
  }
  if (wasm->tables.empty()) {
    // Add an imported table in exactly the same manner as the LLVM wasm backend
    // would add one.
    auto* table = wasm->addTable(Builder::makeTable(Name::fromInt(0)));
    table->module = ENV;
    table->base = "__indirect_function_table";
  }
  f->body =
    builder.makeCallIndirect(wasm->tables[0]->name, fptr, args, funcType);

  wasm->addFunction(std::move(f));
  exportFunction(*wasm, name, true);
}